

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HttpContext.cpp
# Opt level: O2

bool __thiscall sing::HttpContext::parseRequest(HttpContext *this)

{
  Buffer *this_00;
  HttpRequestParseState HVar1;
  bool bVar2;
  undefined8 in_RAX;
  char *pcVar3;
  char *colon;
  bool bVar4;
  undefined8 uStack_38;
  
  this_00 = &this->input;
  bVar2 = true;
  uStack_38 = in_RAX;
  bVar4 = bVar2;
  while (bVar2 != false) {
    HVar1 = this->state;
    if (HVar1 == BODY) {
      this->state = FINSH;
      bVar2 = false;
    }
    else if (HVar1 == HEADERS) {
      pcVar3 = Buffer::findCRLF(this_00);
      bVar2 = false;
      if (pcVar3 != (char *)0x0) {
        uStack_38 = CONCAT17(0x3a,(undefined7)uStack_38);
        colon = std::__find_if<char_const*,__gnu_cxx::__ops::_Iter_equals_val<char_const>>
                          ((this->input).buffer.super__Vector_base<char,_std::allocator<char>_>.
                           _M_impl.super__Vector_impl_data._M_start + (this->input).readIndex,pcVar3
                           ,(long)&uStack_38 + 7);
        if (colon == pcVar3) {
          this->state = BODY;
        }
        else {
          HttpRequest::addHeader
                    (&this->request,
                     (this->input).buffer.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                     super__Vector_impl_data._M_start + (this->input).readIndex,colon,pcVar3);
        }
        Buffer::retrieveUntil(this_00,pcVar3 + 2);
        bVar2 = true;
      }
    }
    else {
      bVar2 = true;
      if (HVar1 == REQUEST_LINE) {
        pcVar3 = Buffer::findCRLF(this_00);
        bVar2 = false;
        if ((pcVar3 != (char *)0x0) &&
           (bVar2 = parseRequestLine(this,(this->input).buffer.
                                          super__Vector_base<char,_std::allocator<char>_>._M_impl.
                                          super__Vector_impl_data._M_start + (this->input).readIndex
                                     ,pcVar3), bVar4 = bVar2, bVar2)) {
          Buffer::retrieveUntil(this_00,pcVar3 + 2);
          this->state = HEADERS;
        }
      }
    }
  }
  return bVar4;
}

Assistant:

bool HttpContext::parseRequest(){
    bool ok = true;
    bool hasMore = true;
    while (hasMore)
    {
        if (state == REQUEST_LINE)
        {
            const char* crlf = input.findCRLF();
            if(crlf){
                ok = parseRequestLine(input.peek(),crlf);
                if(ok){
                    input.retrieveUntil(crlf + 2);
                    state = HEADERS;
                }else{
                    hasMore = false;
                }
            }else{
                hasMore = false;
            }

        }else if (state == HEADERS)
        {
            const char* crlf = input.findCRLF();
            if(crlf){
                const char* colon = std::find(input.peek(),crlf,':');
                if(colon!=crlf){
                    request.addHeader(input.peek(),colon,crlf);
                }else{
                    state = BODY;
                    hasMore = true;
                }
                input.retrieveUntil(crlf + 2);

            }else{
                hasMore = false;
            }

        }else if (state==BODY)
        {
            //TO ADD: process requestbody
            state = FINSH;
            hasMore = false;
        }
    }

    return ok;
}